

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int translateCursorShape(int shape)

{
  int shape_local;
  int local_4;
  
  switch(shape) {
  case 0x36001:
    local_4 = 0x44;
    break;
  case 0x36002:
    local_4 = 0x98;
    break;
  case 0x36003:
    local_4 = 0x22;
    break;
  case 0x36004:
    local_4 = 0x3a;
    break;
  case 0x36005:
    local_4 = 0x6c;
    break;
  case 0x36006:
    local_4 = 0x74;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int translateCursorShape(int shape)
{
    switch (shape)
    {
        case GLFW_ARROW_CURSOR:
            return XC_left_ptr;
        case GLFW_IBEAM_CURSOR:
            return XC_xterm;
        case GLFW_CROSSHAIR_CURSOR:
            return XC_crosshair;
        case GLFW_HAND_CURSOR:
            return XC_hand1;
        case GLFW_HRESIZE_CURSOR:
            return XC_sb_h_double_arrow;
        case GLFW_VRESIZE_CURSOR:
            return XC_sb_v_double_arrow;
    }

    return 0;
}